

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CastInstr *castInstr)

{
  allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_> *this_00;
  allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>
  *this_01;
  Opcode opc;
  initializer_list<std::pair<const_flow::LiteralType,_flow::Opcode>_> __l;
  initializer_list<std::pair<const_flow::LiteralType,_flow::Opcode>_> __l_00;
  initializer_list<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>
  __l_01;
  bool bVar1;
  int iVar2;
  LiteralType LVar3;
  LiteralType LVar4;
  Value *pVVar5;
  pointer pvVar6;
  pointer pvVar7;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  *local_210;
  _Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false> _Stack_1d8;
  Opcode op;
  LiteralType local_1cc;
  _Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false> local_1c8;
  const_iterator k;
  unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
  *sub;
  LiteralType local_1ac;
  _Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
  local_1a8;
  const_iterator i;
  key_equal local_198;
  hasher local_197;
  Opcode local_196;
  LiteralType local_194;
  pair<const_flow::LiteralType,_flow::Opcode> local_190;
  iterator local_188;
  size_type local_180;
  unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
  local_178;
  LiteralType local_140 [5];
  allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_> local_12b;
  key_equal local_12a;
  hasher local_129;
  pair<const_flow::LiteralType,_flow::Opcode> local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  iterator local_100;
  size_type local_f8;
  unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
  local_f0;
  LiteralType local_b4;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  *local_b0;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  local_a8;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  local_68;
  iterator local_28;
  __buckets_ptr local_20;
  Value *local_18;
  CastInstr *castInstr_local;
  TargetCodeGenerator *this_local;
  
  local_18 = (Value *)castInstr;
  castInstr_local = (CastInstr *)this;
  if ((visit(flow::CastInstr&)::map == '\0') &&
     (iVar2 = __cxa_guard_acquire(&visit(flow::CastInstr&)::map), iVar2 != 0)) {
    i.
    super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
    ._M_cur._6_1_ = 1;
    local_b0 = &local_a8;
    local_b4 = String;
    local_118 = 0x4600000006;
    uStack_110 = 0x4700000007;
    local_128.first = Number;
    local_128.second = N2S;
    local_128._6_2_ = 0;
    uStack_120 = 0x4500000005;
    local_100 = &local_128;
    local_f8 = 4;
    std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>::allocator(&local_12b);
    __l_00._M_len = local_f8;
    __l_00._M_array = local_100;
    std::
    unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
    ::unordered_map(&local_f0,__l_00,0,&local_129,&local_12a,&local_12b);
    std::
    pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
    ::pair<flow::LiteralType,_true>(&local_a8,&local_b4,&local_f0);
    local_140[0] = Number;
    local_194 = String;
    local_196 = S2N;
    local_b0 = &local_68;
    std::pair<const_flow::LiteralType,_flow::Opcode>::pair<flow::LiteralType,_flow::Opcode,_true>
              (&local_190,&local_194,&local_196);
    local_188 = &local_190;
    local_180 = 1;
    this_00 = (allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_> *)
              ((long)&i.
                      super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                      ._M_cur + 7);
    std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>::allocator(this_00);
    __l._M_len = local_180;
    __l._M_array = local_188;
    std::
    unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
    ::unordered_map(&local_178,__l,0,&local_197,&local_198,this_00);
    std::
    pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
    ::pair<flow::LiteralType,_true>(&local_68,local_140,&local_178);
    i.
    super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
    ._M_cur._6_1_ = 0;
    local_28 = &local_a8;
    local_20 = (__buckets_ptr)0x2;
    this_01 = (allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>
               *)((long)&i.
                         super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                         ._M_cur + 3);
    std::
    allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>
    ::allocator(this_01);
    __l_01._M_len = (size_type)local_20;
    __l_01._M_array = local_28;
    std::
    unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
    ::unordered_map(&visit::map,__l_01,0,
                    (hasher *)
                    ((long)&i.
                            super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                            ._M_cur + 5),
                    (key_equal *)
                    ((long)&i.
                            super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                            ._M_cur + 4),this_01);
    std::
    allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>
    ::~allocator((allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>
                  *)((long)&i.
                            super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                            ._M_cur + 3));
    local_210 = (pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
                 *)&local_28;
    do {
      local_210 = local_210 + -1;
      std::
      pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
      ::~pair(local_210);
    } while (local_210 != &local_a8);
    std::
    unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
    ::~unordered_map(&local_178);
    std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>::~allocator
              ((allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_> *)
               ((long)&i.
                       super__Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                       ._M_cur + 7));
    std::
    unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
    ::~unordered_map(&local_f0);
    std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>::~allocator(&local_12b);
    __cxa_atexit(std::
                 unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
                 ::~unordered_map,&visit::map,&__dso_handle);
    __cxa_guard_release(&visit(flow::CastInstr&)::map);
  }
  LVar3 = Value::type(local_18);
  pVVar5 = CastInstr::source((CastInstr *)local_18);
  LVar4 = Value::type(pVVar5);
  if (LVar3 == LVar4) {
    pVVar5 = CastInstr::source((CastInstr *)local_18);
    emitLoad(this,pVVar5);
  }
  else {
    local_1ac = Value::type(local_18);
    local_1a8._M_cur =
         (__node_type *)
         std::
         unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
         ::find(&visit::map,&local_1ac);
    sub = (unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
           *)std::
             unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
             ::end(&visit::map);
    bVar1 = std::__detail::operator!=
                      (&local_1a8,
                       (_Node_iterator_base<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false>
                        *)&sub);
    if (!bVar1) {
      __assert_fail("i != map.end() && \"Cast target type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x200,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    pvVar6 = std::__detail::
             _Node_const_iterator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>,_false,_false>
                           *)&local_1a8);
    k.super__Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>)
         (_Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>)
         &pvVar6->second;
    pVVar5 = CastInstr::source((CastInstr *)local_18);
    local_1cc = Value::type(pVVar5);
    local_1c8._M_cur =
         (__node_type *)
         std::
         unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
         ::find(&pvVar6->second,&local_1cc);
    _Stack_1d8._M_cur =
         (__node_type *)
         std::
         unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
         ::end(k.super__Node_iterator_base<std::pair<const_flow::LiteralType,_flow::Opcode>,_false>.
               _M_cur);
    bVar1 = std::__detail::operator!=(&local_1c8,&stack0xfffffffffffffe28);
    if (!bVar1) {
      __assert_fail("k != sub.end() && \"Cast source type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x205,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    pvVar7 = std::__detail::
             _Node_const_iterator<std::pair<const_flow::LiteralType,_flow::Opcode>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_flow::LiteralType,_flow::Opcode>,_false,_false>
                         *)&local_1c8);
    opc = pvVar7->second;
    pVVar5 = CastInstr::source((CastInstr *)local_18);
    emitLoad(this,pVVar5);
    emitInstr(this,opc);
    changeStack(this,1,local_18);
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CastInstr& castInstr) {
  // map of (target, source, opcode)
  static const std::unordered_map<
      LiteralType,
      std::unordered_map<LiteralType, Opcode>> map = {
        {LiteralType::String, {
          {LiteralType::Number, Opcode::N2S},
          {LiteralType::IPAddress, Opcode::P2S},
          {LiteralType::Cidr, Opcode::C2S},
          {LiteralType::RegExp, Opcode::R2S},
        }},
        {LiteralType::Number, {
          {LiteralType::String, Opcode::S2N},
        }},
      };

  // just alias same-type casts
  if (castInstr.type() == castInstr.source()->type()) {
    emitLoad(castInstr.source());
    return;
  }

  // lookup target type
  const auto i = map.find(castInstr.type());
  assert(i != map.end() && "Cast target type not found.");

  // lookup source type
  const auto& sub = i->second;
  auto k = sub.find(castInstr.source()->type());
  assert(k != sub.end() && "Cast source type not found.");
  Opcode op = k->second;

  // emit instruction
  emitLoad(castInstr.source());
  emitInstr(op);
  changeStack(1, &castInstr);
}